

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagewindow.cc
# Opt level: O1

void __thiscall bgui::ImageWindow::onKey(ImageWindow *this,char c,SpecialKey key,int x,int y)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  _func_int **pp_Var7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  byte f;
  undefined7 in_register_00000031;
  undefined8 uVar8;
  ImageAdapterBase *pIVar9;
  undefined8 uVar10;
  uint uVar11;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  int h;
  ostringstream out;
  undefined1 auStack_1c8 [8];
  int local_1c0;
  undefined4 uStack_1bc;
  undefined1 local_1b0 [16];
  int local_1a0;
  undefined4 uStack_19c;
  ios_base local_130 [264];
  
  iVar4 = (int)CONCAT71(in_register_00000031,c);
  this->lastkey = c;
  if (iVar4 == 0x68) {
    bVar1 = BaseWindow::hasInfoText(&this->super_BaseWindow);
    if (bVar1) goto LAB_0010decb;
    pcVar5 = (this->helptext)._M_dataplus._M_p;
LAB_0010df52:
    BaseWindow::setInfoText(&this->super_BaseWindow,pcVar5);
    goto switchD_0010df0c_caseD_63;
  }
  if (iVar4 == 0x76) {
    bVar1 = BaseWindow::hasInfoText(&this->super_BaseWindow);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"This program is based on cvkit version ",0x27);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"2.6.17",6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"Copyright (C) 2016 - 2023 Roboception GmbH\n",0x2b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "Copyright (C) 2014, 2015 Institute of Robotics and Mechatronics, German Aerospace Center\n"
                 ,0x59);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"Author: Heiko Hirschmueller\n",0x1c);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"Contact: heiko.hirschmueller@roboception.de\n",0x2c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "This program is based in part on the work of the Independent JPEG Group.\n",0x49);
      pcVar5 = (char *)png_get_copyright(0);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)auStack_1c8 +
                        (int)*(undefined8 *)(CONCAT44(uStack_19c,local_1a0) + -0x18) + 0x28);
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,pcVar5,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"\n",1);
      std::__cxx11::stringbuf::str();
      BaseWindow::setInfoText(&this->super_BaseWindow,(char *)CONCAT44(uStack_1bc,local_1c0));
      if ((undefined1 *)CONCAT44(uStack_1bc,local_1c0) != local_1b0) {
        operator_delete((undefined1 *)CONCAT44(uStack_1bc,local_1c0));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
      std::ios_base::~ios_base(local_130);
      goto switchD_0010df0c_caseD_63;
    }
LAB_0010decb:
    pcVar5 = "";
    goto LAB_0010df52;
  }
  BaseWindow::setInfoText(&this->super_BaseWindow,"");
  iVar2 = (int)c;
  if (iVar2 < 0x47) {
    switch(iVar2) {
    case 0x2b:
      pp_Var7 = (this->super_BaseWindow)._vptr_BaseWindow;
      uVar8 = 3;
      uVar10 = 8;
      goto LAB_0010e0a5;
    case 0x2c:
    case 0x2e:
    case 0x2f:
    case 0x33:
      goto switchD_0010df0c_caseD_63;
    case 0x2d:
      pp_Var7 = (this->super_BaseWindow)._vptr_BaseWindow;
      uVar8 = 4;
      uVar10 = 0x10;
LAB_0010e0a5:
      (*pp_Var7[3])(this,uVar8,(ulong)(uint)x,(ulong)(uint)y,uVar10);
      goto switchD_0010df0c_caseD_63;
    case 0x30:
      if (this->adapt == (ImageAdapterBase *)0x0) goto switchD_0010df0c_caseD_63;
      this->adapt->scale = 1.0;
      break;
    case 0x31:
    case 0x32:
    case 0x34:
      if (this->adapt == (ImageAdapterBase *)0x0) goto switchD_0010df0c_caseD_63;
      this->adapt->gamma = (double)(iVar4 + -0x30);
      break;
    default:
      if (iVar2 == 0x42) {
        if (this->adapt != (ImageAdapterBase *)0x0) {
          this->adapt->channel = 2;
        }
      }
      else {
        if (iVar2 != 0x43) goto switchD_0010df0c_caseD_63;
        if (this->adapt != (ImageAdapterBase *)0x0) {
          this->adapt->channel = -1;
        }
      }
      goto LAB_0010e4f0;
    }
    goto LAB_0010e3d0;
  }
  switch(iVar2) {
  case 0x61:
    if (this->adapt == (ImageAdapterBase *)0x0) goto switchD_0010df0c_caseD_63;
    BaseWindow::getSize(&this->super_BaseWindow,&local_1a0,&local_1c0);
    (*this->adapt->_vptr_ImageAdapterBase[4])
              (this->adapt,(long)this->imx,(long)this->imy,(long)local_1a0,(long)local_1c0);
    break;
  case 0x62:
    if (this->adapt == (ImageAdapterBase *)0x0) goto switchD_0010df0c_caseD_63;
    BaseWindow::getSize(&this->super_BaseWindow,&local_1a0,&local_1c0);
    uVar11 = this->imx + x;
    if ((int)uVar11 < 0) goto switchD_0010df0c_caseD_63;
    iVar4 = (*this->adapt->_vptr_ImageAdapterBase[0xb])();
    if (((x < 0) || (CONCAT44(extraout_var,iVar4) <= (long)(ulong)uVar11)) ||
       ((local_1a0 <= x || (uVar11 = this->imy + y, (int)uVar11 < 0))))
    goto switchD_0010df0c_caseD_63;
    iVar4 = (*this->adapt->_vptr_ImageAdapterBase[0xc])();
    if ((((y < 0) || (CONCAT44(extraout_var_00,iVar4) <= (long)(ulong)uVar11)) || (local_1c0 <= y))
       || ((*this->adapt->_vptr_ImageAdapterBase[9])
                     (this->adapt,(long)x + (long)this->imx,(long)y + (long)this->imy),
          0x7fefffffffffffff < (ulong)ABS(extraout_XMM0_Qa))) goto switchD_0010df0c_caseD_63;
    this->adapt->imin = extraout_XMM0_Qa;
    break;
  case 99:
  case 100:
  case 0x65:
  case 0x67:
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x75:
  case 0x76:
    goto switchD_0010df0c_caseD_63;
  case 0x66:
    if (this->adapt == (ImageAdapterBase *)0x0) goto switchD_0010df0c_caseD_63;
    BaseWindow::getSize(&this->super_BaseWindow,&local_1a0,&local_1c0);
    iVar4 = (*this->adapt->_vptr_ImageAdapterBase[0xb])();
    this->imx = iVar4 - (local_1a0 + this->imx);
    pIVar9 = this->adapt;
    iVar4 = pIVar9->rotation;
    f = pIVar9->flip ^ 1;
    goto LAB_0010e379;
  case 0x69:
    this->showinfo = (bool)(this->showinfo ^ 1);
    goto LAB_0010e3dd;
  case 0x6c:
    if (this->adapt == (ImageAdapterBase *)0x0) goto switchD_0010df0c_caseD_63;
    iVar4 = this->imx;
    iVar2 = this->imy;
    BaseWindow::getSize(&this->super_BaseWindow,&local_1a0,&local_1c0);
    if (this->adapt->flip == true) {
      iVar3 = (*this->adapt->_vptr_ImageAdapterBase[0xb])();
      iVar4 = iVar3 - (iVar4 + local_1a0);
    }
    this->imx = (local_1c0 / 2 + iVar2) - local_1a0 / 2;
    iVar2 = (*this->adapt->_vptr_ImageAdapterBase[0xb])();
    this->imy = (iVar2 + ~(local_1a0 / 2 + iVar4)) - local_1c0 / 2;
    if (this->adapt->flip == true) {
      iVar4 = (*this->adapt->_vptr_ImageAdapterBase[0xc])();
      this->imx = iVar4 - (local_1a0 + this->imx);
    }
    pIVar9 = this->adapt;
    iVar4 = pIVar9->rotation + -1;
    goto LAB_0010e250;
  case 0x6d:
    pIVar9 = this->adapt;
    if (pIVar9 == (ImageAdapterBase *)0x0) goto switchD_0010df0c_caseD_63;
    if ((ulong)pIVar9->map < 3) {
      pIVar9->map = *(mapping *)(&DAT_0011b984 + (ulong)pIVar9->map * 4);
    }
    goto LAB_0010e4f0;
  case 0x71:
    BaseWindow::sendClose(&this->super_BaseWindow);
    goto switchD_0010df0c_caseD_63;
  case 0x72:
    if (this->adapt == (ImageAdapterBase *)0x0) goto switchD_0010df0c_caseD_63;
    iVar4 = this->imx;
    iVar2 = this->imy;
    BaseWindow::getSize(&this->super_BaseWindow,&local_1a0,&local_1c0);
    if (this->adapt->flip == true) {
      iVar3 = (*this->adapt->_vptr_ImageAdapterBase[0xb])();
      iVar4 = iVar3 - (iVar4 + local_1a0);
    }
    iVar3 = (*this->adapt->_vptr_ImageAdapterBase[0xc])();
    this->imx = (iVar3 + ~(iVar2 + local_1c0 / 2)) - local_1a0 / 2;
    this->imy = (iVar4 - local_1c0 / 2) + local_1a0 / 2;
    if (this->adapt->flip == true) {
      iVar4 = (*this->adapt->_vptr_ImageAdapterBase[0xc])();
      this->imx = iVar4 - (local_1a0 + this->imx);
    }
    pIVar9 = this->adapt;
    iVar4 = pIVar9->rotation + 1;
LAB_0010e250:
    f = pIVar9->flip;
LAB_0010e379:
    ImageAdapterBase::setRotationFlip(pIVar9,iVar4,(bool)f);
    break;
  case 0x73:
    if (this->adapt != (ImageAdapterBase *)0x0) {
      iVar4 = (*this->adapt->_vptr_ImageAdapterBase[0xb])();
      iVar2 = (*this->adapt->_vptr_ImageAdapterBase[0xc])();
      BaseWindow::setSize(&this->super_BaseWindow,iVar4,iVar2);
    }
    goto switchD_0010df0c_caseD_63;
  case 0x74:
    pIVar9 = this->adapt;
    if (pIVar9 == (ImageAdapterBase *)0x0) goto switchD_0010df0c_caseD_63;
    iVar4 = (*pIVar9->_vptr_ImageAdapterBase[3])(pIVar9);
    (*pIVar9->_vptr_ImageAdapterBase[2])(pIVar9,(ulong)(byte)((byte)iVar4 ^ 1));
    break;
  case 0x77:
    if (this->adapt == (ImageAdapterBase *)0x0) goto switchD_0010df0c_caseD_63;
    BaseWindow::getSize(&this->super_BaseWindow,&local_1a0,&local_1c0);
    uVar11 = this->imx + x;
    if ((int)uVar11 < 0) goto switchD_0010df0c_caseD_63;
    iVar4 = (*this->adapt->_vptr_ImageAdapterBase[0xb])();
    if ((((x < 0) || (CONCAT44(extraout_var_01,iVar4) <= (long)(ulong)uVar11)) || (local_1a0 <= x))
       || (uVar11 = this->imy + y, (int)uVar11 < 0)) goto switchD_0010df0c_caseD_63;
    iVar4 = (*this->adapt->_vptr_ImageAdapterBase[0xc])();
    if (((y < 0) || (CONCAT44(extraout_var_02,iVar4) <= (long)(ulong)uVar11)) ||
       ((local_1c0 <= y ||
        ((*this->adapt->_vptr_ImageAdapterBase[9])
                   (this->adapt,(long)x + (long)this->imx,(long)y + (long)this->imy),
        0x7fefffffffffffff < (ulong)ABS(extraout_XMM0_Qa_00))))) goto switchD_0010df0c_caseD_63;
    this->adapt->imax = extraout_XMM0_Qa_00;
    break;
  default:
    if (iVar2 == 0x47) {
      if (this->adapt != (ImageAdapterBase *)0x0) {
        this->adapt->channel = 1;
      }
    }
    else {
      if (iVar2 != 0x52) goto switchD_0010df0c_caseD_63;
      if (this->adapt != (ImageAdapterBase *)0x0) {
        this->adapt->channel = 0;
      }
    }
LAB_0010e4f0:
    redrawImage(this,true);
    goto switchD_0010df0c_caseD_63;
  }
LAB_0010e3d0:
  redrawImage(this,true);
LAB_0010e3dd:
  updateInfo(this);
switchD_0010df0c_caseD_63:
  if (key == k_esc) {
    BaseWindow::sendClose(&this->super_BaseWindow);
  }
  return;
}

Assistant:

void ImageWindow::onKey(char c, SpecialKey key, int x, int y)
{
  lastkey=c;

  if (c != 'h' && c != 'v')
  {
    setInfoText("");
  }

  switch (c)
  {
    case '0':
      if (adapt != 0)
      {
        adapt->setScale(1);
        redrawImage();
        updateInfo();
      }

      break;

    case '1':
    case '2':
    case '4':
      if (adapt != 0)
      {
        adapt->setGamma(c-'1'+1);
        redrawImage();
        updateInfo();
      }

      break;

    case 'R':
      if (adapt != 0)
      {
        adapt->setChannel(0);
      }

      redrawImage();
      break;

    case 'G':
      if (adapt != 0)
      {
        adapt->setChannel(1);
      }

      redrawImage();
      break;

    case 'B':
      if (adapt != 0)
      {
        adapt->setChannel(2);
      }

      redrawImage();
      break;

    case 'C':
      if (adapt != 0)
      {
        adapt->setChannel(-1);
      }

      redrawImage();
      break;

    case '+':
      onMousePressed(button4, x, y, button4mask);
      break;

    case '-':
      onMousePressed(button5, x, y, button5mask);
      break;

    case 't':
      if (adapt != 0)
      {
        adapt->setSmoothing(!adapt->getSmoothing());
        redrawImage();
        updateInfo();
      }

      break;

    case 'a':
      if (adapt != 0)
      {
        int w, h;

        getSize(w, h);

        adapt->adaptMinMaxIntensity(imx, imy, w, h);
        redrawImage();
        updateInfo();
      }

      break;

    case 'b':
      if (adapt != 0)
      {
        int w, h;

        getSize(w, h);

        if (x+imx >= 0 && x+imx < adapt->getWidth() && x >= 0 && x < w
            && y+imy >= 0 && y+imy < adapt->getHeight() && y >= 0 && y < h)
        {
          double v=adapt->getIntensityOfPixel(x+imx, y+imy);

          if (std::isfinite(v))
          {
            adapt->setMinIntensity(v);
            redrawImage();
            updateInfo();
          }
        }
      }

      break;

    case 'w':
      if (adapt != 0)
      {
        int w, h;

        getSize(w, h);

        if (x+imx >= 0 && x+imx < adapt->getWidth() && x >= 0 && x < w
            && y+imy >= 0 && y+imy < adapt->getHeight() && y >= 0 && y < h)
        {
          double v=adapt->getIntensityOfPixel(x+imx, y+imy);

          if (std::isfinite(v))
          {
            adapt->setMaxIntensity(v);
            redrawImage();
            updateInfo();
          }
        }
      }

      break;

    case 'm':
      if (adapt != 0)
      {
        switch (adapt->getMapping())
        {
          case map_raw:
            adapt->setMapping(map_jet);
            break;

          case map_jet:
            adapt->setMapping(map_rainbow);
            break;

          case map_rainbow:
            adapt->setMapping(map_raw);
            break;
        }

        redrawImage();
      }

      break;

    case 'i':
      showinfo=!showinfo;
      updateInfo();
      break;

    case 'h':
      if (!hasInfoText())
      {
        setInfoText(helptext.c_str());
      }
      else
      {
        setInfoText("");
      }

      break;

    case 'v':
      if (!hasInfoText())
      {
        std::ostringstream out;

        out << "This program is based on cvkit version " << VERSION << "\n";
        out << "Copyright (C) 2016 - 2023 Roboception GmbH\n";
        out << "Copyright (C) 2014, 2015 Institute of Robotics and Mechatronics, German Aerospace Center\n";
        out << "Author: Heiko Hirschmueller\n";
        out << "Contact: heiko.hirschmueller@roboception.de\n";
#ifdef INCLUDE_GDAL
        out << "\n";
        out << "This program is based in part on the Geospatial Data Abstraction Library (GDAL).\n";
#endif
#if defined (INCLUDE_GDAL) || defined (INCLUDE_JPEG)
        out << "\n";
        out << "This program is based in part on the work of the Independent JPEG Group.\n";
#endif
#if defined (INCLUDE_PNG)
        out << png_get_copyright(0) << "\n";
#endif
        setInfoText(out.str().c_str());
      }
      else
      {
        setInfoText("");
      }

      break;

    case 's':
      if (adapt != 0)
      {
        setSize(adapt->getWidth(), adapt->getHeight());
      }

      break;

    case 'l':
      if (adapt != 0)
      {
        // rotation around center of image part

        int x=imx;
        int y=imy;
        int w, h;

        getSize(w, h);

        if (adapt->getFlip())
        {
          x=adapt->getWidth()-w-x;
        }

        imx=y+h/2-w/2;
        imy=adapt->getWidth()-1-(x+w/2)-h/2;

        if (adapt->getFlip())
        {
          imx=adapt->getHeight()-w-imx;
        }

        adapt->setRotationFlip(adapt->getRotation()-1, adapt->getFlip());

        redrawImage();
        updateInfo();
      }

      break;

    case 'r':
      if (adapt != 0)
      {
        // rotation around center of image part

        int x=imx;
        int y=imy;
        int w, h;

        getSize(w, h);

        if (adapt->getFlip())
        {
          x=adapt->getWidth()-w-x;
        }

        imx=adapt->getHeight()-1-(y+h/2)-w/2;
        imy=x+w/2-h/2;

        if (adapt->getFlip())
        {
          imx=adapt->getHeight()-w-imx;
        }

        adapt->setRotationFlip(adapt->getRotation()+1, adapt->getFlip());

        redrawImage();
        updateInfo();
      }

      break;

    case 'f':
      if (adapt != 0)
      {
        // flip at center of image part

        int w, h;

        getSize(w, h);

        imx=adapt->getWidth()-w-imx;

        adapt->setRotationFlip(adapt->getRotation(), !adapt->getFlip());

        redrawImage();
        updateInfo();
      }

      break;

    case 'q':
      sendClose();
      break;
  }

  if (key == k_esc)
  {
    sendClose();
  }
}